

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O0

void __thiscall QString::reserve(QString *this,qsizetype asize)

{
  bool bVar1;
  qsizetype qVar2;
  longlong *plVar3;
  QArrayDataPointer<char16_t> *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QFlagsStorage<QArrayData::ArrayOption> in_stack_ffffffffffffffbc;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffffc0;
  qsizetype local_18;
  QArrayDataPointer<char16_t> *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  bVar1 = QArrayDataPointer<char16_t>::needsDetach(in_stack_ffffffffffffffc0);
  if (!bVar1) {
    in_stack_ffffffffffffffc0 = (QArrayDataPointer<char16_t> *)capacity((QString *)0x110957);
    qVar2 = QArrayDataPointer<char16_t>::freeSpaceAtBegin(local_10);
    if ((long)local_10 < (long)in_stack_ffffffffffffffc0 - qVar2) goto LAB_001109ab;
  }
  local_18 = size(in_RDI);
  plVar3 = qMax<long_long>((longlong *)&local_10,&local_18);
  ::QString::reallocData((longlong)in_RDI,(AllocationOption)*plVar3);
LAB_001109ab:
  qVar2 = QArrayDataPointer<char16_t>::constAllocatedCapacity(in_stack_ffffffffffffffc0);
  if (qVar2 != 0) {
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffbc.i);
    QArrayDataPointer<char16_t>::setFlag
              ((QArrayDataPointer<char16_t> *)0x1109d8,(ArrayOptions)in_stack_ffffffffffffffbc.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QString::reserve(qsizetype asize)
{
    if (d.needsDetach() || asize >= capacity() - d.freeSpaceAtBegin())
        reallocData(qMax(asize, size()), QArrayData::KeepSize);
    if (d.constAllocatedCapacity())
        d.setFlag(Data::CapacityReserved);
}